

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralString.cpp
# Opt level: O2

LiteralString *
Js::LiteralString::New(StaticType *type,char16 *content,charcount_t charLength,Recycler *recycler)

{
  Recycler *alloc;
  LiteralString *this;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  local_50 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_85b7404;
  data.filename._0_4_ = 0x24;
  alloc = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_50);
  this = (LiteralString *)new<Memory::Recycler>(0x20,alloc,0x37a1d4);
  LiteralString(this,type,content,charLength);
  return this;
}

Assistant:

LiteralString* LiteralString::New(StaticType* type, const char16* content, charcount_t charLength, Recycler* recycler)
    {
        return RecyclerNew(recycler, LiteralString, type, content, charLength);
    }